

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O0

void fdb_cmp_func_list_from_filemgr(filemgr *file,list *cmp_func_list)

{
  undefined8 *puVar1;
  avl_node *paVar2;
  size_t sVar3;
  void *pvVar4;
  list *in_RSI;
  long in_RDI;
  avl_node *a;
  kvs_node *kvs_node;
  cmp_func_node *node;
  avl_node *local_28;
  
  if (((in_RDI != 0) && (*(long *)(in_RDI + 0x170) != 0)) && (in_RSI != (list *)0x0)) {
    pthread_spin_lock((pthread_spinlock_t *)(*(long *)(in_RDI + 0x170) + 0x38));
    if (*(long *)(*(long *)(in_RDI + 0x170) + 8) != 0) {
      puVar1 = (undefined8 *)calloc(1,0x28);
      puVar1[1] = *(undefined8 *)(*(long *)(in_RDI + 0x170) + 8);
      puVar1[2] = *(undefined8 *)(*(long *)(in_RDI + 0x170) + 0x10);
      *puVar1 = 0;
      list_push_back(in_RSI,(list_elem *)(puVar1 + 3));
    }
    local_28 = avl_first(*(avl_tree **)(*(long *)(in_RDI + 0x170) + 0x18));
    while (local_28 != (avl_node *)0x0) {
      paVar2 = avl_next(local_28);
      puVar1 = (undefined8 *)calloc(1,0x28);
      puVar1[1] = local_28[-6].right;
      puVar1[2] = local_28[-5].parent;
      sVar3 = strlen((char *)local_28[-7].left);
      pvVar4 = calloc(1,sVar3 + 1);
      *puVar1 = pvVar4;
      strcpy((char *)*puVar1,(char *)local_28[-7].left);
      list_push_back(in_RSI,(list_elem *)(puVar1 + 3));
      local_28 = paVar2;
    }
    pthread_spin_unlock((pthread_spinlock_t *)(*(long *)(in_RDI + 0x170) + 0x38));
  }
  return;
}

Assistant:

void fdb_cmp_func_list_from_filemgr(struct filemgr *file, struct list *cmp_func_list)
{
    if (!file || !file->kv_header || !cmp_func_list) {
        return;
    }

    struct cmp_func_node *node;

    spin_lock(&file->kv_header->lock);
    // Default KV store cmp function
    if (file->kv_header->default_kvs_cmp) {
        node = (struct cmp_func_node*)calloc(1, sizeof(struct cmp_func_node));
        node->func = file->kv_header->default_kvs_cmp;
        node->user_param = file->kv_header->default_kvs_cmp_param;
        node->kvs_name = NULL;
        list_push_back(cmp_func_list, &node->le);
    }

    // Rest of KV stores
    struct kvs_node *kvs_node;
    struct avl_node *a = avl_first(file->kv_header->idx_name);
    while (a) {
        kvs_node = _get_entry(a, struct kvs_node, avl_name);
        a = avl_next(a);
        node = (struct cmp_func_node*)calloc(1, sizeof(struct cmp_func_node));
        node->func = kvs_node->custom_cmp;
        node->user_param = kvs_node->user_param;
        node->kvs_name = (char*)calloc(1, strlen(kvs_node->kvs_name)+1);
        strcpy(node->kvs_name, kvs_node->kvs_name);
        list_push_back(cmp_func_list, &node->le);
    }
    spin_unlock(&file->kv_header->lock);
}